

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O1

char * igets(void)

{
  char *pcVar1;
  char *pcVar2;
  
  pcVar2 = PatchPt;
  if ((*PatchPt != '\0') && (pcVar1 = PatchPt, PatchPt < PatchFile + PatchSize)) {
    do {
      PatchPt = pcVar1;
      if (*PatchPt == '\0') {
        return pcVar2;
      }
      pcVar1 = PatchPt + 1;
    } while (*PatchPt != '\n');
    *PatchPt = '\0';
    PatchPt = pcVar1;
    return pcVar2;
  }
  return (char *)0x0;
}

Assistant:

static char *igets (void)
{
	char *line;

	if (*PatchPt == '\0' || PatchPt >= PatchFile + PatchSize )
		return NULL;

	line = PatchPt;

	while (*PatchPt != '\n' && *PatchPt != '\0')
		PatchPt++;

	if (*PatchPt == '\n')
		*PatchPt++ = 0;

	return line;
}